

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall
Lowerer::TryGenerateFastBrOrCmTypeOf
          (Lowerer *this,Instr *instr,Instr **prev,bool isNeqOp,bool *pfNoLower)

{
  IRKind IVar1;
  Opnd *pOVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  undefined4 *puVar6;
  Instr *pIVar7;
  RegOpnd *pRVar8;
  RegOpnd *this_00;
  RegOpnd *opnd;
  AddrOpnd *pAVar9;
  JITJavascriptString *pJVar10;
  StackSym *pSVar11;
  BranchInstr *pBVar12;
  Opnd *pOVar13;
  Instr *this_01;
  uint uVar14;
  RegOpnd *pRVar15;
  RegOpnd *pRVar16;
  Lowerer *this_02;
  IntConstType IStack_80;
  undefined1 local_60 [8];
  InternalString typeNameString;
  
  if (prev == (Instr **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6172,"(prev)","prev");
    if (!bVar4) goto LAB_0057195d;
    *puVar6 = 0;
  }
  uVar14 = instr->m_opcode - 0xc;
  if (((0x36 < uVar14) || ((0x70800000000303U >> ((ulong)uVar14 & 0x3f) & 1) == 0)) &&
     (3 < instr->m_opcode - 0x194)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x617e,
                       "(instr->m_opcode == Js::OpCode::BrSrEq_A || instr->m_opcode == Js::OpCode::BrSrNeq_A || instr->m_opcode == Js::OpCode::BrSrNotEq_A || instr->m_opcode == Js::OpCode::BrSrNotNeq_A || instr->m_opcode == Js::OpCode::CmSrEq_A || instr->m_opcode == Js::OpCode::CmSrNeq_A || instr->m_opcode == Js::OpCode::BrEq_A || instr->m_opcode == Js::OpCode::BrNeq_A || instr->m_opcode == Js::OpCode::BrNotEq_A || instr->m_opcode == Js::OpCode::BrNotNeq_A || instr->m_opcode == Js::OpCode::CmEq_A || instr->m_opcode == Js::OpCode::CmNeq_A)"
                       ,
                       "instr->m_opcode == Js::OpCode::BrSrEq_A || instr->m_opcode == Js::OpCode::BrSrNeq_A || instr->m_opcode == Js::OpCode::BrSrNotEq_A || instr->m_opcode == Js::OpCode::BrSrNotNeq_A || instr->m_opcode == Js::OpCode::CmSrEq_A || instr->m_opcode == Js::OpCode::CmSrNeq_A || instr->m_opcode == Js::OpCode::BrEq_A || instr->m_opcode == Js::OpCode::BrNeq_A || instr->m_opcode == Js::OpCode::BrNotEq_A || instr->m_opcode == Js::OpCode::BrNotNeq_A || instr->m_opcode == Js::OpCode::CmEq_A || instr->m_opcode == Js::OpCode::CmNeq_A"
                      );
    if (!bVar4) goto LAB_0057195d;
    *puVar6 = 0;
  }
  bVar4 = false;
  pIVar7 = instr;
  while ((pIVar7 = IR::Instr::GetPrevRealInstrOrLabel(pIVar7), pIVar7 != (Instr *)0x0 &&
         (pIVar7->m_opcode == Ld_A))) {
    bVar4 = IR::Opnd::IsRegOpnd(pIVar7->m_dst);
    if (!bVar4) {
      return false;
    }
    pRVar8 = IR::Opnd::AsRegOpnd(pIVar7->m_dst);
    if ((pRVar8->field_0x18 & 8) == 0) {
      return false;
    }
    bVar4 = true;
    if ((pIVar7->field_0x38 & 0x10) != 0) {
      return false;
    }
  }
  bVar5 = IR::Opnd::IsRegOpnd(instr->m_src1);
  if (bVar5) {
    pRVar8 = IR::Opnd::AsRegOpnd(instr->m_src1);
  }
  else {
    pRVar8 = (RegOpnd *)0x0;
  }
  bVar5 = IR::Opnd::IsRegOpnd(instr->m_src2);
  if (bVar5) {
    this_00 = IR::Opnd::AsRegOpnd(instr->m_src2);
  }
  else {
    this_00 = (RegOpnd *)0x0;
  }
  if ((pIVar7 == (Instr *)0x0) || (pIVar7->m_opcode != Typeof)) {
LAB_00571543:
    if (pRVar8 == (RegOpnd *)0x0) {
      return false;
    }
  }
  else {
    bVar5 = IR::Opnd::IsRegOpnd(pIVar7->m_dst);
    if (bVar5) {
      opnd = IR::Opnd::AsRegOpnd(pIVar7->m_dst);
    }
    else {
      opnd = (RegOpnd *)0x0;
    }
    if (((this_00 == (RegOpnd *)0x0) || (pRVar8 == (RegOpnd *)0x0)) || (opnd == (RegOpnd *)0x0))
    goto LAB_00571543;
    pRVar15 = pRVar8;
    pRVar16 = this_00;
    if (((pRVar8->m_sym == opnd->m_sym) ||
        (pRVar15 = this_00, pRVar16 = pRVar8, this_00->m_sym == opnd->m_sym)) &&
       ((pRVar15->field_0x18 & 1) != 0)) {
      if ((~*(uint *)&pRVar16->m_sym->field_0x18 & 0x401) != 0) {
        return false;
      }
      bVar5 = IR::Opnd::IsAddrOpnd(((pRVar16->m_sym->field_5).m_instrDef)->m_src1);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x61c1,"(idOpnd->m_sym->m_instrDef->GetSrc1()->IsAddrOpnd())",
                           "idOpnd->m_sym->m_instrDef->GetSrc1()->IsAddrOpnd()");
        if (!bVar5) goto LAB_0057195d;
        *puVar6 = 0;
      }
      pAVar9 = IR::Opnd::AsAddrOpnd(((pRVar16->m_sym->field_5).m_instrDef)->m_src1);
      pJVar10 = JITJavascriptString::FromVar(pAVar9->m_localAddress);
      IStack_80 = 0;
      Js::InternalString::InternalString
                ((InternalString *)local_60,pJVar10->m_pszValue,pJVar10->m_charLength,'\0');
      bVar5 = Js::InternalStringComparer::Equals
                        ((InternalString *)local_60,
                         (InternalString *)Js::Type::UndefinedTypeNameString);
      if (!bVar5) {
        bVar5 = Js::InternalStringComparer::Equals
                          ((InternalString *)local_60,
                           (InternalString *)Js::Type::ObjectTypeNameString);
        if (bVar5) {
          IStack_80 = 0x1c;
        }
        else {
          bVar5 = Js::InternalStringComparer::Equals
                            ((InternalString *)local_60,
                             (InternalString *)Js::Type::BooleanTypeNameString);
          if (bVar5) {
            IStack_80 = 2;
          }
          else {
            bVar5 = Js::InternalStringComparer::Equals
                              ((InternalString *)local_60,
                               (InternalString *)Js::Type::NumberTypeNameString);
            if (bVar5) {
              IStack_80 = 4;
            }
            else {
              bVar5 = Js::InternalStringComparer::Equals
                                ((InternalString *)local_60,
                                 (InternalString *)Js::Type::StringTypeNameString);
              if (bVar5) {
                IStack_80 = 7;
              }
              else {
                bVar5 = Js::InternalStringComparer::Equals
                                  ((InternalString *)local_60,
                                   (InternalString *)Js::Type::FunctionTypeNameString);
                if (!bVar5) {
                  return false;
                }
                IStack_80 = 0x1b;
              }
            }
          }
        }
      }
      typeNameString.m_content.ptr =
           (char16_t *)IR::IntConstOpnd::New(IStack_80,TyInt32,instr->m_func,false);
      if (bVar4) {
        pOVar2 = pIVar7->m_src1;
        this_01 = pIVar7;
        while (this_01 = IR::Instr::GetNextRealInstr(this_01), this_01 != instr) {
          bVar4 = IR::Opnd::IsEqual(this_01->m_dst,&opnd->super_Opnd);
          if ((bVar4) || (bVar4 = IR::Opnd::IsEqual(this_01->m_dst,pOVar2), bVar4)) {
            return false;
          }
        }
        IR::Instr::Unlink(pIVar7);
        IR::Instr::InsertBefore(instr,pIVar7);
      }
      pOVar2 = pIVar7->m_src1;
      bVar4 = IR::Opnd::IsRegOpnd(pOVar2);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x61f7,"(objectOpnd->IsRegOpnd())","objectOpnd->IsRegOpnd()");
        if (!bVar4) {
LAB_0057195d:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar6 = 0;
      }
      *prev = pIVar7->m_prev;
      *pfNoLower = false;
      IVar1 = instr->m_kind;
      pRVar8 = IR::Opnd::AsRegOpnd(pOVar2);
      if (IVar1 == InstrKindBranch) {
        GenerateFastBrTypeOf
                  (this,instr,pRVar8,(IntConstOpnd *)typeNameString.m_content.ptr,pIVar7,pfNoLower,
                   isNeqOp);
      }
      else {
        GenerateFastCmTypeOf
                  (this,instr,pRVar8,(IntConstOpnd *)typeNameString.m_content.ptr,pIVar7,pfNoLower,
                   isNeqOp);
      }
      return true;
    }
  }
  pSVar11 = IR::Opnd::GetStackSym(&pRVar8->super_Opnd);
  if (this_00 == (RegOpnd *)0x0) {
    return false;
  }
  if ((*(uint *)&pSVar11->field_0x18 & 1) == 0) {
    return false;
  }
  if ((pSVar11->field_5).m_instrDef == (Instr *)0x0) {
    return false;
  }
  pSVar11 = IR::Opnd::GetStackSym(&this_00->super_Opnd);
  if ((pSVar11->field_0x18 & 1) == 0) {
    return false;
  }
  if ((pSVar11->field_5).m_instrDef == (Instr *)0x0) {
    return false;
  }
  pSVar11 = IR::Opnd::GetStackSym(&pRVar8->super_Opnd);
  if ((pSVar11->field_0x18 & 1) == 0) {
    pIVar7 = (Instr *)0x0;
  }
  else {
    pIVar7 = (pSVar11->field_5).m_instrDef;
  }
  if (pIVar7->m_opcode == Typeof) {
    pSVar11 = IR::Opnd::GetStackSym(&this_00->super_Opnd);
    if ((pSVar11->field_0x18 & 1) == 0) {
      pIVar7 = (Instr *)0x0;
    }
    else {
      pIVar7 = (pSVar11->field_5).m_instrDef;
    }
    if (pIVar7->m_opcode == Typeof) goto LAB_00571644;
    pSVar11 = IR::Opnd::GetStackSym(&this_00->super_Opnd);
    bVar4 = StackSym::GetIsStrConst(pSVar11);
    if (bVar4) goto LAB_00571644;
  }
  pSVar11 = IR::Opnd::GetStackSym(&this_00->super_Opnd);
  if ((pSVar11->field_0x18 & 1) == 0) {
    pIVar7 = (Instr *)0x0;
  }
  else {
    pIVar7 = (pSVar11->field_5).m_instrDef;
  }
  if (pIVar7->m_opcode != Typeof) {
    return false;
  }
  pSVar11 = IR::Opnd::GetStackSym(&pRVar8->super_Opnd);
  if ((pSVar11->field_0x18 & 1) == 0) {
    pIVar7 = (Instr *)0x0;
  }
  else {
    pIVar7 = (pSVar11->field_5).m_instrDef;
  }
  if (pIVar7->m_opcode != Typeof) {
    pSVar11 = IR::Opnd::GetStackSym(&pRVar8->super_Opnd);
    bVar4 = StackSym::GetIsStrConst(pSVar11);
    if (!bVar4) {
      return false;
    }
  }
LAB_00571644:
  *pfNoLower = true;
  if (instr->m_kind == InstrKindBranch) {
    this_02 = (Lowerer *)instr;
    pBVar12 = IR::Instr::AsBranchInstr(instr);
    InsertCompareBranch(this_02,&pRVar8->super_Opnd,&this_00->super_Opnd,isNeqOp | BrEq_A,
                        pBVar12->m_branchTarget,instr,false);
  }
  else {
    bVar4 = IR::Opnd::IsEqual(&pRVar8->super_Opnd,&this_00->super_Opnd);
    pOVar2 = instr->m_dst;
    if (bVar4) {
      pOVar13 = LoadLibraryValueOpnd(this,instr,isNeqOp + ValueTrue);
      InsertMove(pOVar2,pOVar13,instr,true);
    }
    else {
      bVar4 = IR::Opnd::IsEqual(pOVar2,&pRVar8->super_Opnd);
      if (bVar4) {
        pIVar7 = IR::Instr::HoistSrc1(instr,Ld_A,RegNOREG,(StackSym *)0x0);
        pIVar7 = LowererMD::ChangeToAssign(pIVar7);
        pRVar8 = IR::Opnd::AsRegOpnd(pIVar7->m_dst);
      }
      bVar4 = IR::Opnd::IsEqual(instr->m_dst,&this_00->super_Opnd);
      if (bVar4) {
        pIVar7 = IR::Instr::HoistSrc2(instr,Ld_A,RegNOREG,(StackSym *)0x0);
        pIVar7 = LowererMD::ChangeToAssign(pIVar7);
        this_00 = IR::Opnd::AsRegOpnd(pIVar7->m_dst);
      }
      pOVar2 = instr->m_dst;
      pOVar13 = LoadLibraryValueOpnd(this,instr,ValueTrue);
      InsertMove(pOVar2,pOVar13,instr,true);
      InsertCompare(&pRVar8->super_Opnd,&this_00->super_Opnd,instr);
      pOVar2 = instr->m_dst;
      pOVar13 = LoadLibraryValueOpnd(this,instr,ValueFalse);
      LowererMD::InsertCmovCC
                ((ushort)!isNeqOp + (ushort)!isNeqOp * 4 + CMOVE,pOVar2,pOVar13,instr,false);
    }
  }
  IR::Instr::Remove(instr);
  return true;
}

Assistant:

bool
Lowerer::TryGenerateFastBrOrCmTypeOf(IR::Instr *instr, IR::Instr **prev, bool isNeqOp, bool *pfNoLower)
{
    Assert(prev);
    Assert(instr->m_opcode == Js::OpCode::BrSrEq_A     ||
           instr->m_opcode == Js::OpCode::BrSrNeq_A    ||
           instr->m_opcode == Js::OpCode::BrSrNotEq_A  ||
           instr->m_opcode == Js::OpCode::BrSrNotNeq_A ||
           instr->m_opcode == Js::OpCode::CmSrEq_A     ||
           instr->m_opcode == Js::OpCode::CmSrNeq_A    ||
           instr->m_opcode == Js::OpCode::BrEq_A       ||
           instr->m_opcode == Js::OpCode::BrNeq_A      ||
           instr->m_opcode == Js::OpCode::BrNotEq_A    ||
           instr->m_opcode == Js::OpCode::BrNotNeq_A   ||
           instr->m_opcode == Js::OpCode::CmEq_A       ||
           instr->m_opcode == Js::OpCode::CmNeq_A);

    //
    // instr         - (Br/Cm)(Sr)(N(ot))eq_A
    // instr->m_prev - typeOf
    //
    IR::Instr *instrLd = instr->GetPrevRealInstrOrLabel();
    bool skippedLoads = false;
    //Skip intermediate Ld_A which might be inserted by flow graph peeps
    while (instrLd && instrLd->m_opcode == Js::OpCode::Ld_A )
    {
        if (!(instrLd->GetDst()->IsRegOpnd() && instrLd->GetDst()->AsRegOpnd()->m_fgPeepTmp))
        {
            return false;
        }
        if (instrLd->HasBailOutInfo())
        {
            return false;
        }
        instrLd = instrLd->GetPrevRealInstrOrLabel();
        skippedLoads = true;
    }

    IR::Instr *typeOf = instrLd;

    IR::RegOpnd *instrSrc1 = instr->GetSrc1()->IsRegOpnd() ? instr->GetSrc1()->AsRegOpnd() : nullptr;
    IR::RegOpnd *instrSrc2 = instr->GetSrc2()->IsRegOpnd() ? instr->GetSrc2()->AsRegOpnd() : nullptr;
    if (typeOf && (typeOf->m_opcode == Js::OpCode::Typeof))
    {
        IR::RegOpnd *typeOfDst = typeOf->GetDst()->IsRegOpnd() ? typeOf->GetDst()->AsRegOpnd() : nullptr;

        if (typeOfDst && instrSrc1 && instrSrc2)
        {
            do
            {
                IR::RegOpnd *typeOpnd = nullptr;
                IR::RegOpnd *idOpnd = nullptr;
                if (instrSrc1->m_sym == typeOfDst->m_sym)
                {
                    typeOpnd = instrSrc1;
                    idOpnd = instrSrc2;
                }
                else if (instrSrc2->m_sym == typeOfDst->m_sym)
                {
                    typeOpnd = instrSrc2;
                    idOpnd = instrSrc1;
                }
                else
                {
                    // Neither source turned out to be the typeOpnd
                    break;
                }

                if (!typeOpnd->m_isTempLastUse)
                {
                    break;
                }

                if (!(idOpnd->m_sym->m_isSingleDef && idOpnd->m_sym->m_isStrConst))
                {
                    return false;
                }

                // The second argument to [Cm|Br]TypeOf is the typeid.
                IR::IntConstOpnd *typeIdOpnd = nullptr;

                Assert(idOpnd->m_sym->m_isSingleDef);
                Assert(idOpnd->m_sym->m_instrDef->GetSrc1()->IsAddrOpnd());

                // We can't optimize non-javascript type strings.
                JITJavascriptString *typeNameJsString = JITJavascriptString::FromVar(idOpnd->m_sym->m_instrDef->GetSrc1()->AsAddrOpnd()->m_localAddress);
                const char16        *typeName = typeNameJsString->GetString();

                Js::InternalString typeNameString(typeName, typeNameJsString->GetLength());
                if (Js::InternalStringComparer::Equals(typeNameString, Js::Type::UndefinedTypeNameString))
                {
                    typeIdOpnd = IR::IntConstOpnd::New(Js::TypeIds_Undefined, TyInt32, instr->m_func);
                }
                else if (Js::InternalStringComparer::Equals(typeNameString, Js::Type::ObjectTypeNameString))
                {
                    typeIdOpnd = IR::IntConstOpnd::New(Js::TypeIds_Object, TyInt32, instr->m_func);
                }
                else if (Js::InternalStringComparer::Equals(typeNameString, Js::Type::BooleanTypeNameString))
                {
                    typeIdOpnd = IR::IntConstOpnd::New(Js::TypeIds_Boolean, TyInt32, instr->m_func);
                }
                else if (Js::InternalStringComparer::Equals(typeNameString, Js::Type::NumberTypeNameString))
                {
                    typeIdOpnd = IR::IntConstOpnd::New(Js::TypeIds_Number, TyInt32, instr->m_func);
                }
                else if (Js::InternalStringComparer::Equals(typeNameString, Js::Type::StringTypeNameString))
                {
                    typeIdOpnd = IR::IntConstOpnd::New(Js::TypeIds_String, TyInt32, instr->m_func);
                }
                else if (Js::InternalStringComparer::Equals(typeNameString, Js::Type::FunctionTypeNameString))
                {
                    typeIdOpnd = IR::IntConstOpnd::New(Js::TypeIds_Function, TyInt32, instr->m_func);
                }
                else
                {
                    return false;
                }

                if (skippedLoads)
                {
                    //validate none of dst of Ld_A overlaps with typeof src or dst
                    IR::Opnd* typeOfSrc = typeOf->GetSrc1();
                    instrLd = typeOf->GetNextRealInstr();
                    while (instrLd != instr)
                    {
                        if (instrLd->GetDst()->IsEqual(typeOfDst) || instrLd->GetDst()->IsEqual(typeOfSrc))
                        {
                            return false;
                        }
                        instrLd = instrLd->GetNextRealInstr();
                    }
                    typeOf->Unlink();
                    instr->InsertBefore(typeOf);
                }
                // The first argument to [Cm|Br]TypeOf is the first arg to the TypeOf instruction.
                IR::Opnd *objectOpnd = typeOf->GetSrc1();
                Assert(objectOpnd->IsRegOpnd());

                // Now emit this instruction and remove the ldstr and typeOf.
                *prev = typeOf->m_prev;
                *pfNoLower = false;
                if (instr->IsBranchInstr())
                {
                    GenerateFastBrTypeOf(instr, objectOpnd->AsRegOpnd(), typeIdOpnd, typeOf, pfNoLower, isNeqOp);
                }
                else
                {
                    GenerateFastCmTypeOf(instr, objectOpnd->AsRegOpnd(), typeIdOpnd, typeOf, pfNoLower, isNeqOp);
                }

                return true;
            } while (false);
        }
    }

    if (instrSrc1 && instrSrc1->GetStackSym()->IsSingleDef() && instrSrc2 && instrSrc2->GetStackSym()->IsSingleDef() &&
        (
            ((instrSrc1->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::Typeof) &&
                ((instrSrc2->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::Typeof) || instrSrc2->GetStackSym()->GetIsStrConst()))
            ||
            ((instrSrc2->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::Typeof) &&
                ((instrSrc1->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::Typeof) || instrSrc1->GetStackSym()->GetIsStrConst()))
            )
        )
    {
        *pfNoLower = true;
        if (instr->IsBranchInstr())
        {
            InsertCompareBranch(instrSrc1, instrSrc2, isNeqOp ? Js::OpCode::BrNeq_A : Js::OpCode::BrEq_A, instr->AsBranchInstr()->GetTarget(), instr);
            instr->Remove();
        }
        else
        {
            if (instrSrc1->IsEqual(instrSrc2))
            {
                InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, isNeqOp ? LibraryValue::ValueFalse : LibraryValue::ValueTrue), instr);
            }
            else
            {
                // t1 = typeof o1
                // t2 = typeof o2
                // dst = t1 == t2

                // MOV dst, true
                // CMP t1, t2

                // x86, amd64
                // CMOVNE dst, false

                // arm
                // BEQ $done
                // MOV dst, false
                // $done

                if (instr->GetDst()->IsEqual(instrSrc1))
                {
                    IR::Instr* hoistInstr = m_lowererMD.ChangeToAssign(instr->HoistSrc1(Js::OpCode::Ld_A));
                    instrSrc1 = hoistInstr->GetDst()->AsRegOpnd();
                }
                if (instr->GetDst()->IsEqual(instrSrc2))
                {
                    IR::Instr* hoistInstr = m_lowererMD.ChangeToAssign(instr->HoistSrc2(Js::OpCode::Ld_A));
                    instrSrc2 = hoistInstr->GetDst()->AsRegOpnd();
                }

                InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, LibraryValue::ValueTrue), instr);

#if defined(_M_ARM32_OR_ARM64)
                IR::LabelInstr * doneLabel = IR::LabelInstr::New(Js::OpCode::Label, instr->m_func);
                InsertCompareBranch(instrSrc1, instrSrc2, isNeqOp ? Js::OpCode::BrNeq_A : Js::OpCode::BrEq_A, doneLabel, instr);
                InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, LibraryValue::ValueFalse), instr);
                instr->InsertBefore(doneLabel);
#else
                InsertCompare(instrSrc1, instrSrc2, instr);
                LowererMD::InsertCmovCC(isNeqOp ? Js::OpCode::CMOVE : Js::OpCode::CMOVNE, instr->GetDst(), LoadLibraryValueOpnd(instr, LibraryValue::ValueFalse), instr);
#endif
            }
            instr->Remove();
        }
        return true;
    }

    return false;
}